

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O2

void http_handler(mg_connection *nc,int ev,void *ev_data)

{
  mbuf *mb;
  size_t *psVar1;
  byte *pbVar2;
  char *__dest;
  byte bVar3;
  mg_connection *pmVar4;
  size_t sVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  mg_str *pmVar9;
  void *pvVar10;
  ushort **ppuVar11;
  __int32_t **pp_Var12;
  ulong uVar13;
  size_t __n;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  ulong n;
  size_t sVar17;
  char *__s;
  ulong uVar18;
  uchar *s;
  ulong uVar19;
  ulong local_710;
  char sha [20];
  char b64_sha [40];
  cs_sha1_ctx local_678;
  char buf [100];
  http_message shm;
  
  mb = &nc->recv_mbuf;
  pmVar4 = nc->listener;
  uVar8 = (uint)(pmVar4 != (mg_connection *)0x0);
  if (ev == 5) {
    sVar5 = (nc->recv_mbuf).len;
    if ((sVar5 != 0) && (iVar7 = mg_parse_http(mb->buf,(int)sVar5,&shm,uVar8), 0 < iVar7)) {
      shm.message.len = (nc->recv_mbuf).len;
      shm.body.len = (size_t)((nc->recv_mbuf).buf + (shm.message.len - (long)shm.body.p));
      mg_call(nc,nc->handler,(pmVar4 == (mg_connection *)0x0) + 100,&shm);
    }
    free_http_proto_data(nc);
  }
  if (nc->proto_data != (void *)0x0) {
    transfer_file_data(nc);
  }
  mg_call(nc,nc->handler,ev,ev_data);
  if (ev != 3) {
    return;
  }
  uVar8 = mg_parse_http((nc->recv_mbuf).buf,(int)(nc->recv_mbuf).len,&shm,uVar8);
  n = (ulong)uVar8;
  if ((int)uVar8 < 1) {
LAB_0010c138:
    if ((int)uVar8 < 0) {
LAB_0010c323:
      if (LL_DEBUG < s_cs_log_level) {
        fprintf(_stderr,"%-20s ","http_handler");
        cs_log_printf("invalid request");
      }
      pbVar2 = (byte *)((long)&nc->flags + 1);
      *pbVar2 = *pbVar2 | 8;
      return;
    }
    if (uVar8 == 0) {
      if ((nc->recv_mbuf).len < 0x2000) {
        return;
      }
      goto LAB_0010c323;
    }
  }
  else {
    pmVar9 = mg_get_http_header(&shm,"Transfer-Encoding");
    if ((pmVar9 != (mg_str *)0x0) && (iVar7 = mg_vcasecmp(pmVar9,"chunked"), iVar7 == 0)) {
      __s = (nc->recv_mbuf).buf + n;
      sVar5 = (nc->recv_mbuf).len;
      pvVar10 = nc->proto_data;
      if (pvVar10 == (void *)0x0) {
        pvVar10 = calloc(1,0x30);
        nc->proto_data = pvVar10;
        if (pvVar10 == (void *)0x0) {
          pbVar2 = (byte *)((long)&nc->flags + 1);
          *pbVar2 = *pbVar2 | 8;
          goto LAB_0010c14b;
        }
      }
      uVar19 = sVar5 - n;
      uVar13 = *(ulong *)((long)pvVar10 + 0x18);
      local_710 = uVar13;
      if (uVar19 < uVar13) {
        __assert_fail("blen >= body_len",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/CryptXor[P]jetservd/mongoose.c"
                      ,0x11d6,
                      "size_t mg_handle_chunked(struct mg_connection *, struct http_message *, char *, size_t)"
                     );
      }
      do {
        uVar18 = uVar19 - uVar13;
        sVar17 = 0;
        for (uVar15 = 0; uVar16 = uVar18, uVar18 != uVar15; uVar15 = uVar15 + 1) {
          ppuVar11 = __ctype_b_loc();
          bVar3 = __s[uVar15 + uVar13];
          uVar16 = uVar15;
          if ((*(byte *)((long)*ppuVar11 + (ulong)bVar3 * 2 + 1) & 0x10) == 0) break;
          if ((byte)(bVar3 - 0x30) < 10) {
            iVar7 = bVar3 - 0x30;
          }
          else {
            pp_Var12 = __ctype_tolower_loc();
            iVar7 = (*pp_Var12)[bVar3] + -0x57;
          }
          sVar17 = sVar17 * 0x10 + (long)iVar7;
        }
        bVar6 = true;
        if ((((((uVar16 == 0) || (uVar15 = uVar16 + 2, uVar18 < uVar15)) ||
              (__s[uVar16 + uVar13] != '\r')) ||
             ((__s[uVar16 + uVar13 + 1] != '\n' || (lVar14 = uVar15 + sVar17, lVar14 == 0)))) ||
            ((uVar16 = lVar14 + 2, uVar18 < uVar16 ||
             ((__s[lVar14 + uVar13] != '\r' || (uVar16 == 0)))))) ||
           (__s[lVar14 + uVar13 + 1] != '\n')) goto LAB_0010c039;
        memmove(__s + local_710,__s + uVar15 + uVar13,sVar17);
        local_710 = local_710 + sVar17;
        uVar13 = uVar13 + uVar16;
        shm.body.len = local_710;
      } while (sVar17 != 0);
      bVar6 = false;
LAB_0010c039:
      sVar17 = uVar13 - local_710;
      if (local_710 <= uVar13 && sVar17 != 0) {
        __n = uVar19 - uVar13;
        if (uVar19 < uVar13) {
          __assert_fail("i <= blen",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/CryptXor[P]jetservd/mongoose.c"
                        ,0x11e9,
                        "size_t mg_handle_chunked(struct mg_connection *, struct http_message *, char *, size_t)"
                       );
        }
        __dest = __s + local_710;
        memmove(__dest,__s + uVar13,__n);
        memset(__dest + (uVar19 - uVar13),0,sVar17);
        psVar1 = &(nc->recv_mbuf).len;
        *psVar1 = *psVar1 - sVar17;
        *(ulong *)((long)pvVar10 + 0x18) = local_710;
        pbVar2 = (byte *)((long)&nc->flags + 1);
        *pbVar2 = *pbVar2 & 0xdf;
        mg_call(nc,nc->handler,0x66,&shm);
        if ((nc->flags & 0x2000) != 0) {
          memset(__s,0,local_710);
          memmove(__s,__dest,__n);
          psVar1 = &(nc->recv_mbuf).len;
          *psVar1 = *psVar1 - local_710;
          *(undefined8 *)((long)pvVar10 + 0x18) = 0;
          shm.body.len = 0;
        }
        if (!bVar6) {
          shm.message.len = __n + *(long *)((long)pvVar10 + 0x18);
        }
      }
      goto LAB_0010c138;
    }
  }
LAB_0010c14b:
  pmVar4 = nc->listener;
  if (pmVar4 == (mg_connection *)0x0) {
    pmVar9 = mg_get_http_header(&shm,"Sec-WebSocket-Accept");
    if (pmVar9 == (mg_str *)0x0) goto LAB_0010c2d8;
    mbuf_remove(mb,n);
    nc->proto_handler = websocket_handler;
    *(byte *)&nc->flags = (byte)nc->flags | 0x80;
  }
  else {
    pmVar9 = mg_get_http_header(&shm,"Sec-WebSocket-Key");
    if (pmVar9 == (mg_str *)0x0) {
LAB_0010c2d8:
      if ((nc->recv_mbuf).len < shm.message.len) {
        return;
      }
      mg_call(nc,nc->handler,(pmVar4 == (mg_connection *)0x0) + 100,&shm);
      mbuf_remove(mb,shm.message.len);
      return;
    }
    mbuf_remove(mb,n);
    nc->proto_handler = websocket_handler;
    *(byte *)&nc->flags = (byte)nc->flags | 0x80;
    mg_call(nc,nc->handler,0x6f,&shm);
    if ((nc->flags & 0x800) != 0) {
      return;
    }
    if ((nc->send_mbuf).len == 0) {
      snprintf(buf,100,"%.*s%s",(ulong)(uint)pmVar9->len,pmVar9->p,
               "258EAFA5-E914-47DA-95CA-C5AB0DC85B11");
      local_678.state[0] = 0x67452301;
      local_678.state[1] = 0xefcdab89;
      local_678.state[2] = 0x98badcfe;
      local_678.state[3] = 0x10325476;
      local_678.state[4] = 0xc3d2e1f0;
      local_678.count[0] = 0;
      local_678.count[1] = 0;
      sVar17 = strlen(buf);
      cs_sha1_update(&local_678,(uchar *)buf,(uint32_t)sVar17);
      cs_sha1_final((uchar *)sha,&local_678);
      cs_base64_encode((uchar *)sha,0x14,b64_sha);
      mg_printf(nc,"%s%s%s",
                "HTTP/1.1 101 Switching Protocols\r\nUpgrade: websocket\r\nConnection: Upgrade\r\nSec-WebSocket-Accept: "
                ,b64_sha,"\r\n\r\n");
    }
  }
  mg_call(nc,nc->handler,0x70,(void *)0x0);
  websocket_handler(nc,3,ev_data);
  return;
}

Assistant:

void http_handler(struct mg_connection *nc, int ev, void *ev_data) {
    struct http_message shm;
    struct http_message *hm = &shm;
#endif
    struct mbuf *io = &nc->recv_mbuf;
    int req_len;
    const int is_req = (nc->listener != NULL);
#ifndef MG_DISABLE_HTTP_WEBSOCKET
    struct mg_str *vec;
#endif
    if (ev == MG_EV_CLOSE) {
        /*
     * For HTTP messages without Content-Length, always send HTTP message
     * before MG_EV_CLOSE message.
     */
        if (io->len > 0 && mg_parse_http(io->buf, io->len, hm, is_req) > 0) {
            int ev2 = is_req ? MG_EV_HTTP_REQUEST : MG_EV_HTTP_REPLY;
            hm->message.len = io->len;
            hm->body.len = io->buf + io->len - hm->body.p;
            mg_call(nc, nc->handler, ev2, hm);
        }
        free_http_proto_data(nc);
    }

    if (nc->proto_data != NULL) {
        transfer_file_data(nc);
    }

    mg_call(nc, nc->handler, ev, ev_data);

    if (ev == MG_EV_RECV) {
        struct mg_str *s;
        req_len = mg_parse_http(io->buf, io->len, hm, is_req);

        if (req_len > 0 &&
            (s = mg_get_http_header(hm, "Transfer-Encoding")) != NULL &&
            mg_vcasecmp(s, "chunked") == 0) {
            mg_handle_chunked(nc, hm, io->buf + req_len, io->len - req_len);
        }

        if (req_len < 0 || (req_len == 0 && io->len >= MG_MAX_HTTP_REQUEST_SIZE)) {
            DBG(("invalid request"));
            nc->flags |= MG_F_CLOSE_IMMEDIATELY;
        } else if (req_len == 0) {
            /* Do nothing, request is not yet fully buffered */
        }
#ifndef MG_DISABLE_HTTP_WEBSOCKET
        else if (nc->listener == NULL &&
                 mg_get_http_header(hm, "Sec-WebSocket-Accept")) {
            /* We're websocket client, got handshake response from server. */
            /* TODO(lsm): check the validity of accept Sec-WebSocket-Accept */
            mbuf_remove(io, req_len);
            nc->proto_handler = websocket_handler;
            nc->flags |= MG_F_IS_WEBSOCKET;
            mg_call(nc, nc->handler, MG_EV_WEBSOCKET_HANDSHAKE_DONE, NULL);
            websocket_handler(nc, MG_EV_RECV, ev_data);
        } else if (nc->listener != NULL &&
                   (vec = mg_get_http_header(hm, "Sec-WebSocket-Key")) != NULL) {
            /* This is a websocket request. Switch protocol handlers. */
            mbuf_remove(io, req_len);
            nc->proto_handler = websocket_handler;
            nc->flags |= MG_F_IS_WEBSOCKET;

            /* Send handshake */
            mg_call(nc, nc->handler, MG_EV_WEBSOCKET_HANDSHAKE_REQUEST, hm);
            if (!(nc->flags & MG_F_CLOSE_IMMEDIATELY)) {
                if (nc->send_mbuf.len == 0) {
                    ws_handshake(nc, vec);
                }
                mg_call(nc, nc->handler, MG_EV_WEBSOCKET_HANDSHAKE_DONE, NULL);
                websocket_handler(nc, MG_EV_RECV, ev_data);
            }
        }
#endif /* MG_DISABLE_HTTP_WEBSOCKET */
        else if (hm->message.len <= io->len) {
            int trigger_ev = nc->listener ? MG_EV_HTTP_REQUEST : MG_EV_HTTP_REPLY;

/* Whole HTTP message is fully buffered, call event handler */

#ifdef MG_ENABLE_JAVASCRIPT
                                                                                                                                    v7_val_t v1, v2, headers, req, args, res;
      struct v7 *v7 = nc->mgr->v7;
      const char *ev_name = trigger_ev == MG_EV_HTTP_REPLY ? "onsnd" : "onrcv";
      int i, js_callback_handled_request = 0;

      if (v7 != NULL) {
        /* Lookup JS callback */
        v1 = v7_get(v7, v7_get_global(v7), "Http", ~0);
        v2 = v7_get(v7, v1, ev_name, ~0);

        /* Create callback params. TODO(lsm): own/disown those */
        args = v7_create_array(v7);
        req = v7_create_object(v7);
        headers = v7_create_object(v7);

        /* Populate request object */
        v7_set(v7, req, "method", ~0, 0,
               v7_create_string(v7, hm->method.p, hm->method.len, 1));
        v7_set(v7, req, "uri", ~0, 0,
               v7_create_string(v7, hm->uri.p, hm->uri.len, 1));
        v7_set(v7, req, "body", ~0, 0,
               v7_create_string(v7, hm->body.p, hm->body.len, 1));
        v7_set(v7, req, "headers", ~0, 0, headers);
        for (i = 0; hm->header_names[i].len > 0; i++) {
          const struct mg_str *name = &hm->header_names[i];
          const struct mg_str *value = &hm->header_values[i];
          v7_set(v7, headers, name->p, name->len, 0,
                 v7_create_string(v7, value->p, value->len, 1));
        }

        /* Invoke callback. TODO(lsm): report errors */
        v7_array_push(v7, args, v7_create_foreign(nc));
        v7_array_push(v7, args, req);
        if (v7_apply(v7, v2, v7_create_undefined(), args, &res) == V7_OK &&
            v7_is_true(v7, res)) {
          js_callback_handled_request++;
        }
      }

      /* If JS callback returns true, stop request processing */
      if (js_callback_handled_request) {
        nc->flags |= MG_F_SEND_AND_CLOSE;
      } else {
        mg_call(nc, nc->handler, trigger_ev, hm);
      }
#else
            mg_call(nc, nc->handler, trigger_ev, hm);
#endif
            mbuf_remove(io, hm->message.len);
        }
    }
}